

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  ulong uVar7;
  char **ppcVar8;
  uint uVar9;
  char **ppcVar11;
  char *extraout_RDX;
  char *pcVar12;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  unsigned_short *in_R8;
  long lStack_50;
  int tok;
  uint uVar10;
  
  ppcVar11 = (char **)(end + -(long)ptr);
  if ((long)ppcVar11 < 1) {
    return -1;
  }
  cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  lVar4 = 1;
  lStack_50 = lVar4;
  if (cVar2 == '\x05') {
    if (ppcVar11 == (char **)0x1) {
      return -2;
    }
    iVar5 = (*enc[3].scanners[1])(enc,ptr,end,ppcVar11);
    if (iVar5 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    lStack_50 = 2;
LAB_00449bc1:
    ppcVar11 = (char **)(ptr + lStack_50);
    while( true ) {
      uVar7 = (long)end - (long)ppcVar11;
      if ((long)uVar7 < 1) {
        return -1;
      }
      uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
      uVar9 = uVar10 - 5;
      if (0x18 < uVar9) break;
      lStack_50 = lVar4;
      switch(uVar10) {
      case 5:
        if (uVar7 == 1) {
          return -2;
        }
        XVar6 = (*enc[2].utf16Convert)
                          (enc,ppcVar11,
                           (char *)((long)&switchD_00449bfd::switchdataD_0053e25c +
                                   (long)(int)(&switchD_00449bfd::switchdataD_0053e25c)[uVar9]),
                           (unsigned_short **)0x1,in_R8);
        lStack_50 = 2;
        break;
      case 6:
        if (uVar7 < 3) {
          return -2;
        }
        XVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar11);
        lStack_50 = 3;
        break;
      case 7:
        if (uVar7 < 4) {
          return -2;
        }
        XVar6 = (*enc[3].scanners[0])
                          (enc,(char *)ppcVar11,
                           (char *)((long)&switchD_00449bfd::switchdataD_0053e25c +
                                   (long)(int)(&switchD_00449bfd::switchdataD_0053e25c)[uVar9]),
                           (char **)0x1);
        lStack_50 = 4;
        break;
      default:
        goto switchD_00449bfd_caseD_8;
      case 9:
      case 10:
      case 0x15:
        iVar5 = normal_checkPiTarget((ENCODING *)ptr,(char *)ppcVar11,(char *)&tok,(int *)0x1);
        if (iVar5 == 0) goto switchD_00449bfd_caseD_1d;
        pcVar12 = extraout_RDX;
        pbVar1 = (byte *)((long)ppcVar11 + 1);
        goto LAB_00449c8e;
      case 0xf:
        iVar5 = normal_checkPiTarget((ENCODING *)ptr,(char *)ppcVar11,(char *)&tok,(int *)0x1);
        if (iVar5 == 0) goto switchD_00449bfd_caseD_1d;
        ppcVar8 = (char **)((long)ppcVar11 + 1);
        if ((char **)end == ppcVar8 || (long)end - (long)ppcVar8 < 0) {
          return -1;
        }
        if (*(char *)ppcVar8 == '>') {
          *nextTokPtr = (char *)((long)ppcVar11 + 2);
          return tok;
        }
        goto LAB_00449dbe;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00449bfd_caseD_16;
      case 0x1d:
        goto switchD_00449bfd_caseD_1d;
      }
      if (XVar6 == XML_CONVERT_COMPLETED) {
switchD_00449bfd_caseD_1d:
        *nextTokPtr = (char *)ppcVar11;
        return 0;
      }
switchD_00449bfd_caseD_16:
      ppcVar11 = (char **)((long)ppcVar11 + lStack_50);
    }
switchD_00449bfd_caseD_8:
    ppcVar8 = ppcVar11;
LAB_00449dbe:
    *nextTokPtr = (char *)ppcVar8;
  }
  else {
    if (cVar2 == '\x06') {
      if (ppcVar11 < (char **)0x3) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[2])(enc,ptr,end,ppcVar11);
      lStack_50 = 3;
LAB_00449b92:
      if (iVar5 != 0) goto LAB_00449bc1;
    }
    else {
      if (cVar2 == '\a') {
        if (ppcVar11 < (char **)0x4) {
          return -2;
        }
        iVar5 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar11);
        lStack_50 = 4;
        goto LAB_00449b92;
      }
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_00449bc1;
    }
switchD_00449cba_caseD_0:
    *nextTokPtr = ptr;
  }
  return 0;
LAB_00449c8e:
  ptr = (char *)pbVar1;
  uVar7 = (long)end - (long)ptr;
  if ((long)uVar7 < 1) {
    return -1;
  }
  bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  if (0xf < (ulong)bVar3) {
switchD_00449cba_caseD_2:
    pbVar1 = (byte *)ptr + 1;
    goto LAB_00449c8e;
  }
  switch(bVar3) {
  case 0:
  case 1:
  case 8:
    goto switchD_00449cba_caseD_0;
  default:
    goto switchD_00449cba_caseD_2;
  case 5:
    if (uVar7 == 1) {
      return -2;
    }
    iVar5 = (*enc[3].literalScanners[1])
                      (enc,ptr,pcVar12,
                       (char **)((long)&switchD_00449cba::switchdataD_0053e2c0 +
                                (long)(int)(&switchD_00449cba::switchdataD_0053e2c0)[bVar3]));
    if (iVar5 != 0) goto switchD_00449cba_caseD_0;
    pcVar12 = extraout_RDX_00;
    pbVar1 = (byte *)ptr + 2;
    break;
  case 6:
    if (uVar7 < 3) {
      return -2;
    }
    iVar5 = (*enc[3].sameName)(enc,ptr,pcVar12);
    if (iVar5 != 0) goto switchD_00449cba_caseD_0;
    pcVar12 = extraout_RDX_01;
    pbVar1 = (byte *)ptr + 3;
    break;
  case 7:
    if (uVar7 < 4) {
      return -2;
    }
    iVar5 = (*enc[3].nameMatchesAscii)
                      (enc,ptr,pcVar12,
                       (char *)((long)&switchD_00449cba::switchdataD_0053e2c0 +
                               (long)(int)(&switchD_00449cba::switchdataD_0053e2c0)[bVar3]));
    if (iVar5 != 0) goto switchD_00449cba_caseD_0;
    pcVar12 = extraout_RDX_02;
    pbVar1 = (byte *)ptr + 4;
    break;
  case 0xf:
    pbVar1 = (byte *)ptr + 1;
    if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
      return -1;
    }
    if (*pbVar1 == 0x3e) {
      *nextTokPtr = (char *)((byte *)ptr + 2);
      return tok;
    }
  }
  goto LAB_00449c8e;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}